

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EigenDecompositionSquare.hpp
# Opt level: O2

void __thiscall
beagle::cpu::EigenDecompositionSquare<float,_1>::updateTransitionMatricesWithModelCategories
          (EigenDecompositionSquare<float,_1> *this,int *eigenIndices,int *probabilityIndices,
          int *firstDerivativeIndices,int *secondDerivativeIndices,double *edgeLengths,
          float **transitionMatrices,int count)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  float *pfVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  uint *puVar14;
  ulong uVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  float fVar19;
  float fVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [64];
  float distance;
  
  auVar26 = ZEXT1664(ZEXT816(0) << 0x40);
  uVar9 = 0;
  do {
    if (uVar9 == (uint)(~(count >> 0x1f) & count)) {
      return;
    }
    iVar16 = 0;
    pfVar1 = transitionMatrices[probabilityIndices[uVar9]];
    fVar19 = (float)edgeLengths[uVar9];
    for (lVar8 = 0; lVar8 < (this->super_EigenDecomposition<float,_1>).kCategoryCount;
        lVar8 = lVar8 + 1) {
      iVar17 = eigenIndices[lVar8];
      pfVar2 = this->gIMatrices[iVar17];
      pfVar10 = this->gEMatrices[iVar17];
      pfVar3 = (this->super_EigenDecomposition<float,_1>).gEigenValues[iVar17];
      uVar6 = (ulong)(this->super_EigenDecomposition<float,_1>).kStateCount;
      uVar11 = uVar6;
      for (iVar17 = 0; uVar5 = (uint)uVar11, iVar17 < (int)uVar5; iVar17 = iVar17 + 1) {
        if (this->isComplex == true) {
          fVar20 = pfVar3[uVar6 + (long)iVar17];
          if ((fVar20 == 0.0) && (!NAN(fVar20))) goto LAB_00147510;
          iVar18 = iVar17 + 1;
          dVar21 = exp((double)(fVar19 * pfVar3[iVar17]));
          dVar22 = cos((double)(fVar19 * fVar20));
          dVar23 = sin((double)(fVar19 * fVar20));
          uVar5 = (this->super_EigenDecomposition<float,_1>).kStateCount;
          pfVar4 = (this->super_EigenDecomposition<float,_1>).matrixTmp;
          lVar12 = (long)(int)(uVar5 * iVar18);
          lVar7 = (long)(int)(iVar17 * uVar5);
          fVar20 = (float)(dVar23 * (double)(float)dVar21);
          for (uVar11 = 0; iVar17 = iVar18, (~((int)uVar5 >> 0x1f) & uVar5) != uVar11;
              uVar11 = uVar11 + 1) {
            auVar25 = ZEXT416((uint)(float)(dVar22 * (double)(float)dVar21));
            auVar24 = vfmadd231ss_fma(ZEXT416((uint)(fVar20 * pfVar2[lVar12 + uVar11])),auVar25,
                                      ZEXT416((uint)pfVar2[lVar7 + uVar11]));
            pfVar4[lVar7 + uVar11] = auVar24._0_4_;
            auVar24 = vfmsub231ss_fma(ZEXT416((uint)(fVar20 * pfVar2[lVar7 + uVar11])),auVar25,
                                      ZEXT416((uint)pfVar2[lVar12 + uVar11]));
            pfVar4[lVar12 + uVar11] = auVar24._0_4_;
          }
        }
        else {
LAB_00147510:
          dVar21 = exp((double)(fVar19 * pfVar3[iVar17]));
          uVar5 = (this->super_EigenDecomposition<float,_1>).kStateCount;
          pfVar4 = (this->super_EigenDecomposition<float,_1>).matrixTmp;
          for (uVar11 = 0; (~((int)uVar5 >> 0x1f) & uVar5) != uVar11; uVar11 = uVar11 + 1) {
            pfVar4[(long)(int)(uVar5 * iVar17) + uVar11] =
                 (float)dVar21 * pfVar2[(long)(int)(uVar5 * iVar17) + uVar11];
          }
        }
        uVar11 = (ulong)uVar5;
        auVar26 = ZEXT1664(ZEXT816(0) << 0x40);
      }
      for (uVar6 = 0; uVar6 != (~((int)uVar5 >> 0x1f) & uVar5); uVar6 = uVar6 + 1) {
        lVar7 = (long)iVar16;
        lVar12 = 0;
        for (uVar13 = 0; uVar13 != (uVar11 & 0xffffffff); uVar13 = uVar13 + 1) {
          auVar24 = ZEXT816(0) << 0x40;
          uVar15 = 0;
          puVar14 = (uint *)((long)(this->super_EigenDecomposition<float,_1>).matrixTmp + lVar12);
          while ((uVar11 & 0xffffffff) != uVar15) {
            pfVar2 = pfVar10 + uVar15;
            uVar15 = uVar15 + 1;
            auVar24 = vfmadd231ss_fma(auVar24,ZEXT416((uint)*pfVar2),ZEXT416(*puVar14));
            puVar14 = puVar14 + (int)uVar5;
          }
          auVar24 = vmaxss_avx(auVar24,auVar26._0_16_);
          lVar12 = lVar12 + 4;
          pfVar1[lVar7] = auVar24._0_4_;
          lVar7 = lVar7 + 1;
        }
        pfVar10 = pfVar10 + (int)uVar5;
        pfVar1[(int)lVar7] = 1.0;
        iVar16 = (int)lVar7 + 1;
      }
    }
    uVar9 = uVar9 + 1;
  } while( true );
}

Assistant:

BEAGLE_CPU_EIGEN_TEMPLATE
void EigenDecompositionSquare<BEAGLE_CPU_EIGEN_GENERIC>::updateTransitionMatricesWithModelCategories(int* eigenIndices,
                                                        const int* probabilityIndices,
                                                        const int* firstDerivativeIndices,
                                                        const int* secondDerivativeIndices,
                                                        const double* edgeLengths,
                                                        REALTYPE** transitionMatrices,
                                                        int count) {

    for (int u = 0; u < count; u++) {
        REALTYPE* transitionMat = transitionMatrices[probabilityIndices[u]];
        const double edgeLength = edgeLengths[u];
        int n = 0;
        for (int l = 0; l < kCategoryCount; l++) {
            const REALTYPE distance = edgeLength;
            const REALTYPE* Ievc = gIMatrices[eigenIndices[l]];
            const REALTYPE* Evec = gEMatrices[eigenIndices[l]];
            const REALTYPE* Eval = gEigenValues[eigenIndices[l]];
            const REALTYPE* EvalImag = Eval + kStateCount;
            for(int i=0; i<kStateCount; i++) {
                if (!isComplex || EvalImag[i] == 0) {
                    const REALTYPE tmp = exp(Eval[i] * distance);
                    for(int j=0; j<kStateCount; j++) {
                        matrixTmp[i*kStateCount+j] = Ievc[i*kStateCount+j] * tmp;
                    }
                } else {
                    // 2 x 2 conjugate block
                    int i2 = i + 1;
                    const REALTYPE b = EvalImag[i];
                    const REALTYPE expat = exp(Eval[i] * distance);
                    const REALTYPE expatcosbt = expat * cos(b * distance);
                    const REALTYPE expatsinbt = expat * sin(b * distance);
                    for(int j=0; j<kStateCount; j++) {
                        matrixTmp[ i*kStateCount+j] = expatcosbt * Ievc[ i*kStateCount+j] +
                                                      expatsinbt * Ievc[i2*kStateCount+j];
                        matrixTmp[i2*kStateCount+j] = expatcosbt * Ievc[i2*kStateCount+j] -
                                                      expatsinbt * Ievc[ i*kStateCount+j];
                    }
                    i++; // processed two conjugate rows
                }
            }

#ifdef DEBUG_COMPLEX
            fprintf(stderr,"[");
                for(int i=0; i<16; i++)
                    fprintf(stderr," %7.5e,",matrixTmp[i]);
                fprintf(stderr,"] -- complex debug\n");
                exit(0);
#endif


            for (int i = 0; i < kStateCount; i++) {
                for (int j = 0; j < kStateCount; j++) {
                    REALTYPE sum = 0.0;
                    for (int k = 0; k < kStateCount; k++)
                        sum += Evec[i*kStateCount+k] * matrixTmp[k*kStateCount+j];
                    if (sum > 0)
                        transitionMat[n] = sum;
                    else
                        transitionMat[n] = 0;
                    n++;
                }
if (T_PAD != 0) {
                transitionMat[n] = 1.0;
                n += T_PAD;
}
            }
        }

        if (DEBUGGING_OUTPUT) {
            int kMatrixSize = kStateCount * kStateCount;
            fprintf(stderr,"transitionMat index=%d brlen=%.5f\n", probabilityIndices[u], edgeLengths[u]);
            for ( int w = 0; w < (20 > kMatrixSize ? 20 : kMatrixSize); ++w)
                fprintf(stderr,"transitionMat[%d] = %.5f\n", w, transitionMat[w]);
        }
    }
}